

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

EdgeData<size_t> * __thiscall
geometrycentral::surface::SurfaceMesh::getEdgeIndices
          (EdgeData<size_t> *__return_storage_ptr__,SurfaceMesh *this)

{
  size_t i;
  unsigned_long uVar1;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> local_60;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> local_48;
  RangeSetBase<geometrycentral::surface::EdgeRangeF> local_30;
  
  MeshData<geometrycentral::surface::Edge,_unsigned_long>::MeshData(__return_storage_ptr__,this);
  local_30.iEnd = this->nEdgesFillCount;
  local_30.iStart = 0;
  local_30.mesh = this;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin(&local_60,&local_30);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end(&local_48,&local_30);
  uVar1 = 0;
  while (local_60.iCurr != local_48.iCurr) {
    (__return_storage_ptr__->data).
    super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.m_storage.m_data
    [local_60.iCurr] = uVar1;
    uVar1 = uVar1 + 1;
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

EdgeData<size_t> SurfaceMesh::getEdgeIndices() {
  EdgeData<size_t> indices(*this);
  size_t i = 0;
  for (Edge e : edges()) {
    indices[e] = i;
    i++;
  }
  return indices;
}